

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

bool __thiscall Clasp::DefaultMinimize::attach(DefaultMinimize *this,Solver *s)

{
  Literal p;
  uint32 uVar1;
  byte bVar2;
  wsum_t *pwVar3;
  UndoInfo *__s;
  long lVar4;
  long lVar5;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  size_type i;
  uint uVar7;
  SharedData *pSVar8;
  uint32 numL;
  VarVec up;
  
  numL = 0;
  up.ebo_.buf = (pointer)0x0;
  up.ebo_.size = 0;
  up.ebo_.cap = 0;
  pSVar8 = (this->super_MinimizeConstraint).shared_ + 1;
  while (p.rep_ = *(uint32 *)&(pSVar8->adjust_).ebo_.buf, 3 < p.rep_) {
    bVar2 = *(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(p.rep_ & 0xfffffffc)) & 3;
    if (bVar2 == 0) {
      Solver::addWatch(s,p,(Constraint *)this,numL);
    }
    else if (bVar2 == (byte)(2U - ((p.rep_ & 2) == 0))) {
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&up,&numL);
    }
    pSVar8 = (SharedData *)&(pSVar8->adjust_).ebo_.size;
    numL = numL + 1;
  }
  uVar7 = this->size_;
  pwVar3 = (wsum_t *)
           operator_new__((ulong)((4 - (uint)(*(uint *)&(this->step_).field_0x4 < 0x40000000)) *
                                 uVar7) << 3);
  this->bounds_ = pwVar3;
  lVar4 = (ulong)uVar7 * 8;
  for (lVar5 = 0; lVar4 - lVar5 != 0; lVar5 = lVar5 + 8) {
    *(undefined8 *)((long)pwVar3 + lVar5) = 0x7fffffffffffffff;
  }
  for (; (ulong)(uVar7 * 3) << 3 != lVar4; lVar4 = lVar4 + 8) {
    *(undefined8 *)((long)pwVar3 + lVar4) = 0;
  }
  stepInit(this,0);
  uVar1 = numL;
  uVar7 = numL * 2;
  __s = (UndoInfo *)operator_new__((ulong)uVar7 * 4 + 4);
  memset(__s,0,(ulong)uVar7 * 4 + 4);
  this->undo_ = __s;
  this->undoTop_ = 0;
  this->posTop_ = uVar1 + 1;
  this->actLev_ = 0;
  uVar6 = extraout_RDX;
  for (uVar7 = 0; uVar7 != up.ebo_.size; uVar7 = uVar7 + 1) {
    propagate(this,s,(Literal)(uint32)uVar6,up.ebo_.buf + uVar7);
    uVar6 = extraout_RDX_00;
  }
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::ebo::~ebo(&up.ebo_);
  return true;
}

Assistant:

bool DefaultMinimize::attach(Solver& s) {
	assert(s.decisionLevel() == 0 && !bounds_);
	uint32 numL = 0;
	VarVec up;
	for (const WeightLiteral* it = shared_->lits; !isSentinel(it->first); ++it, ++numL) {
		if (s.value(it->first.var()) == value_free) {
			s.addWatch(it->first, this, numL);
		}
		else if (s.isTrue(it->first)) {
			up.push_back(numL);
		}
	}
	bounds_ = new wsum_t[(numRules() * (3 + uint32(step_.type != 0)))]; // upper, sum, temp, lower
	std::fill(this->opt(), this->sum(), SharedData::maxBound());
	std::fill(this->sum(), this->end(), wsum_t(0));
	stepInit(0);
	// [0,numL+1)      : undo stack
	// [numL+1, numL*2): pos  stack
	undo_    = new UndoInfo[(numL*2)+1];
	undoTop_ = 0;
	posTop_  = numL+1;
	actLev_  = 0;
	for (WeightVec::size_type i = 0; i != up.size(); ++i) {
		DefaultMinimize::propagate(s, shared_->lits[up[i]].first, up[i]);
	}
	return true;
}